

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
::emplace<helics::route_id_const&,helics::ActionMessage&>
          (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
           *this,route_id *args,ActionMessage *args_1)

{
  bool bVar1;
  undefined8 in_RDX;
  bool *in_RSI;
  ActionMessage *in_RDI;
  unique_lock<std::mutex> pullLock;
  bool expEmpty;
  unique_lock<std::mutex> pushLock;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
  *in_stack_ffffffffffffffb0;
  ActionMessage *this_00;
  
  this_00 = in_RDI;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_RDI,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar1 = std::
          vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
          ::empty(in_stack_ffffffffffffffb0);
  if (bVar1) {
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)this_00,in_RSI,SUB81((ulong)in_RDX >> 0x38,0),
                       (memory_order)in_RDX);
    if (bVar1) {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_RDI);
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)in_RDI,
                 (mutex_type *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffff9f);
      bVar1 = std::
              vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
              ::empty(in_stack_ffffffffffffffb0);
      if (bVar1) {
        std::
        vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
        ::emplace_back<helics::route_id_const&,helics::ActionMessage&>
                  (in_stack_ffffffffffffffb0,
                   (route_id *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI)
        ;
      }
      else {
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)in_RDI);
        std::
        vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
        ::emplace_back<helics::route_id_const&,helics::ActionMessage&>
                  (in_stack_ffffffffffffffb0,
                   (route_id *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI)
        ;
      }
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_RDI);
    }
    else {
      std::
      vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
      ::emplace_back<helics::route_id_const&,helics::ActionMessage&>
                (in_stack_ffffffffffffffb0,
                 (route_id *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI);
      bVar1 = std::atomic<bool>::compare_exchange_strong
                        ((atomic<bool> *)this_00,in_RSI,SUB81((ulong)in_RDX >> 0x38,0),
                         (memory_order)in_RDX);
      if (bVar1) {
        std::condition_variable::notify_all();
      }
    }
  }
  else {
    std::
    vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
    ::emplace_back<helics::route_id_const&,helics::ActionMessage&>
              (in_stack_ffffffffffffffb0,
               (route_id *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_RDI);
  return;
}

Assistant:

void emplace(Args&&... args)
        {
            std::unique_lock<MUTEX> pushLock(
                m_pushLock);  // only one lock on this branch
            if (pushElements.empty()) {
                bool expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    // release the push lock so we don't get a potential
                    // deadlock condition
                    pushLock.unlock();
                    std::unique_lock<MUTEX> pullLock(
                        m_pullLock);  // first pullLock
                    queueEmptyFlag = false;  // need to set the flag again after
                                             // we get the lock
                    if (pullElements.empty()) {
                        pullElements.emplace_back(std::forward<Args>(args)...);
                    } else {
                        pushLock.lock();
                        pushElements.emplace_back(std::forward<Args>(args)...);
                    }

                    condition.notify_all();
                    return;
                } else {
                    pushElements.emplace_back(std::forward<Args>(args)...);
                    expEmpty = true;
                    if (queueEmptyFlag.compare_exchange_strong(
                            expEmpty, false)) {
                        condition.notify_all();
                    }
                    return;
                }
            }
            pushElements.emplace_back(std::forward<Args>(args)...);
        }